

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInWitnessByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,
              uint32_t stack_index,char **stack_data)

{
  ByteData *pBVar1;
  ConfidentialTransaction *this;
  char *pcVar2;
  CfdException *pCVar3;
  ulong uVar4;
  ulong uVar5;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  TxInReference ref;
  bool local_1e5;
  int local_1e4;
  undefined1 local_1e0 [16];
  _func_int *local_1d0 [2];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1c0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1a8;
  ConfidentialTxInReference local_190;
  
  local_1e4 = stack_type;
  cfd::Initialize();
  pBVar1 = &local_190.super_AbstractTxInReference.txid_.data_;
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_190);
  if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  if (stack_data == (char **)0x0) {
    local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f647a;
    local_190.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0xe9a;
    local_190.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInWitnessByHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_190,kCfdLogLevelWarning,"stack data is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Failed to parameter. stack data is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_190);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_1a8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e5 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_1e5);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransaction *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_190);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_1e5 == true) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_190,(Transaction *)this,txin_index);
    if (local_1e4 != 0) {
      local_1e0._0_8_ = "cfdcapi_transaction.cpp";
      local_1e0._8_4_ = 0xead;
      local_1d0[0] = (_func_int *)0x5f6bdd;
      cfd::core::logger::log<int&>
                ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"Invalid stack type[{}]",
                 &local_1e4);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Invalid stack type.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1e0);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_1e0._0_8_ = &PTR__ScriptWitness_00735628;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_1e0 + 8),
               &local_190.super_AbstractTxInReference.script_witness_.witness_stack_);
    cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_1a8,&local_1c0);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1c0);
    local_1e0._0_8_ = &PTR__ScriptWitness_00735628;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_1e0 + 8))
    ;
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_190.super_AbstractTxInReference)
    ;
  }
  else {
    cfd::core::ConfidentialTransaction::GetTxIn(&local_190,this,txin_index);
    if (local_1e4 == 1) {
      local_1e0._0_8_ = &PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 (local_1e0 + 8),&local_190.pegin_witness_.witness_stack_);
      cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_1a8,&local_1c0);
    }
    else {
      if (local_1e4 != 0) {
        local_1e0._0_8_ = "cfdcapi_transaction.cpp";
        local_1e0._8_4_ = 0xebc;
        local_1d0[0] = (_func_int *)0x5f6bdd;
        cfd::core::logger::log<int&>
                  ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"Invalid stack type[{}]",
                   &local_1e4);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1e0._0_8_ = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Invalid stack type.","");
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1e0);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      local_1e0._0_8_ = &PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 (local_1e0 + 8),
                 &local_190.super_AbstractTxInReference.script_witness_.witness_stack_);
      cfd::core::ScriptWitness::GetWitness(&local_1c0,(ScriptWitness *)local_1e0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_1a8,&local_1c0);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1c0);
    local_1e0._0_8_ = &PTR__ScriptWitness_00735628;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_1e0 + 8))
    ;
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  }
  uVar5 = ((long)local_1a8.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_1a8.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar4 = (ulong)stack_index;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&local_190,
               local_1a8.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start + uVar4);
    pcVar2 = cfd::capi::CreateString((string *)&local_190);
    *stack_data = pcVar2;
    if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
      operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a8);
    return 0;
  }
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f647a;
  local_190.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0xec7;
  local_190.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetTxInWitnessByHandle";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_190,kCfdLogLevelWarning,"stackIndex is illegal.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Failed to parameter. stackIndex out of witness stack.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&local_190);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInWitnessByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        witness_stack = ref.GetScriptWitness().GetWitness();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        witness_stack = ref.GetPeginWitness().GetWitness();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}